

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonIterativeFeaturePreservingMeshFiltering.cpp
# Opt level: O2

void __thiscall
NonIterativeFeaturePreservingMeshFiltering::mollifiedNormals
          (NonIterativeFeaturePreservingMeshFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *face_centroid,vector<double,_std::allocator<double>_> *face_area,double sigma_f,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *mollified_normals)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  pointer pVVar9;
  double dVar10;
  VertexHandle _vh;
  Point *pPVar11;
  size_type __new_size;
  Normal *pNVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  VertexIter VVar17;
  FaceIter FVar18;
  undefined1 local_2f8 [8];
  TriMesh temp_mesh;
  undefined1 local_88 [8];
  VertexIter v_it;
  undefined1 auStack_68 [8];
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> vertex_face_neighbor;
  Point local_48;
  
  v_it._8_8_ = sigma_f;
  OpenMesh::TriMesh_ArrayKernelT<MyTraits>::TriMesh_ArrayKernelT
            ((TriMesh_ArrayKernelT<MyTraits> *)local_2f8,mesh);
  _local_88 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)mesh);
  dVar10 = (double)v_it._8_8_ * 0.5;
  while( true ) {
    VVar17 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)mesh);
    if ((BaseHandle)v_it.mesh_._0_4_ == VVar17.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
        local_88 == (undefined1  [8])VVar17.mesh_) break;
    pPVar11 = OpenMesh::
              AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
              point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     *)mesh,(VertexHandle)v_it.mesh_._0_4_);
    dVar1 = (pPVar11->super_VectorDataT<double,_3>).values_[0];
    dVar2 = (pPVar11->super_VectorDataT<double,_3>).values_[1];
    dVar3 = (pPVar11->super_VectorDataT<double,_3>).values_[2];
    _auStack_68 = (FaceIter)ZEXT816(0);
    vertex_face_neighbor.
    super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    getVertexFaceNeighbor
              (this,mesh,face_centroid,(VertexHandle)v_it.mesh_._0_4_,(double)v_it._8_8_,
               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_68);
    local_48.super_VectorDataT<double,_3>.values_[2] = 0.0;
    local_48.super_VectorDataT<double,_3>.values_[0] = 0.0;
    local_48.super_VectorDataT<double,_3>.values_[1] = 0.0;
    dVar7 = 0.0;
    for (lVar13 = 0;
        lVar13 < (int)((ulong)((long)vertex_face_neighbor.
                                     super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_68)
                      >> 2); lVar13 = lVar13 + 1) {
      iVar8 = *(int *)((long)&(((mesh_ptr)auStack_68)->super_ArrayKernel).super_BaseKernel.
                              _vptr_BaseKernel + lVar13 * 4);
      pVVar9 = (face_centroid->
               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dVar4 = pVVar9[iVar8].super_VectorDataT<double,_3>.values_[0];
      dVar5 = pVVar9[iVar8].super_VectorDataT<double,_3>.values_[1];
      dVar6 = pVVar9[iVar8].super_VectorDataT<double,_3>.values_[2];
      dVar15 = dVar4 - dVar1;
      dVar14 = dVar5 - dVar2;
      dVar16 = dVar6 - dVar3;
      dVar15 = SQRT(dVar16 * dVar16 + dVar15 * dVar15 + dVar14 * dVar14);
      temp_mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _544_8_ = dVar7;
      dVar15 = exp((dVar15 * -0.5 * dVar15) / (dVar10 * dVar10));
      dVar7 = (face_area->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start
              [*(int *)((long)&(((ArrayKernel *)auStack_68)->super_BaseKernel)._vptr_BaseKernel +
                       lVar13 * 4)];
      local_48.super_VectorDataT<double,_3>.values_[0] =
           dVar4 * dVar7 * dVar15 + local_48.super_VectorDataT<double,_3>.values_[0];
      local_48.super_VectorDataT<double,_3>.values_[1] =
           dVar5 * dVar7 * dVar15 + local_48.super_VectorDataT<double,_3>.values_[1];
      local_48.super_VectorDataT<double,_3>.values_[2] =
           dVar6 * dVar7 * dVar15 + local_48.super_VectorDataT<double,_3>.values_[2];
      dVar7 = (double)temp_mesh.super_Mesh.
                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                      .
                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      ._544_8_ + dVar7 * dVar15;
    }
    local_48.super_VectorDataT<double,_3>.values_[0] =
         local_48.super_VectorDataT<double,_3>.values_[0] / dVar7;
    local_48.super_VectorDataT<double,_3>.values_[1] =
         local_48.super_VectorDataT<double,_3>.values_[1] / dVar7;
    local_48.super_VectorDataT<double,_3>.values_[2] =
         local_48.super_VectorDataT<double,_3>.values_[2] / dVar7;
    _vh = OpenMesh::ArrayKernel::vertex_handle((ArrayKernel *)local_2f8,v_it.mesh_._0_4_);
    OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
    set_point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *
              )local_2f8,(VertexHandle)_vh.super_BaseHandle.idx_,&local_48);
    std::_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~_Vector_base
              ((_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
               auStack_68);
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  *)local_88,0);
  }
  __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                      .
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           + 0x28))(mesh);
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (mollified_normals,__new_size);
  OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
  request_face_normals
            ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
             local_2f8);
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::update_face_normals
            ((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)local_2f8);
  _auStack_68 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)local_2f8);
  while( true ) {
    FVar18 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)local_2f8);
    if ((BaseHandle)
        vertex_face_neighbor.
        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ == FVar18.hnd_.super_BaseHandle.idx_.super_BaseHandle
        && auStack_68 == (undefined1  [8])FVar18.mesh_) break;
    pNVar12 = OpenMesh::
              AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
              normal((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      *)local_2f8,
                     (FaceHandle)
                     vertex_face_neighbor.
                     super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                     ._M_impl.super__Vector_impl_data._M_start._0_4_);
    pVVar9 = (mollified_normals->
             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pVVar9[vertex_face_neighbor.
           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_].super_VectorDataT<double,_3>.values_[2] =
         (pNVar12->super_VectorDataT<double,_3>).values_[2];
    dVar10 = (pNVar12->super_VectorDataT<double,_3>).values_[1];
    pVVar9 = pVVar9 + vertex_face_neighbor.
                      super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_;
    (pVVar9->super_VectorDataT<double,_3>).values_[0] =
         (pNVar12->super_VectorDataT<double,_3>).values_[0];
    (pVVar9->super_VectorDataT<double,_3>).values_[1] = dVar10;
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)auStack_68,0);
  }
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_2f8);
  return;
}

Assistant:

void NonIterativeFeaturePreservingMeshFiltering::mollifiedNormals(TriMesh &mesh, std::vector<TriMesh::Point> &face_centroid, std::vector<double> &face_area, double sigma_f,
                                                                  std::vector<TriMesh::Normal> &mollified_normals)
{
    TriMesh temp_mesh = mesh;

    double sigma_m = sigma_f / 2.0;

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        TriMesh::Point pt = mesh.point(*v_it);

        std::vector<TriMesh::FaceHandle> vertex_face_neighbor;
        getVertexFaceNeighbor(mesh, face_centroid, *v_it, sigma_f, vertex_face_neighbor);

        TriMesh::Point new_point(0.0, 0.0, 0.0);
        double weight_sum = 0.0;
        for(int i = 0; i < (int)vertex_face_neighbor.size(); i++)
        {
            TriMesh::Point centroid = face_centroid[vertex_face_neighbor[i].idx()];

            double dis = (centroid - pt).length();
            double weight = std::exp(- 0.5 * dis * dis / (sigma_m * sigma_m));

            double area = face_area[vertex_face_neighbor[i].idx()];
            new_point += centroid * area * weight;
            weight_sum += area * weight;
        }
        new_point /= weight_sum;

        int vertex_index = (*v_it).idx();
        TriMesh::VertexHandle vh = temp_mesh.vertex_handle(vertex_index);
        temp_mesh.set_point(vh, new_point);
    }

    mollified_normals.resize(mesh.n_faces());
    temp_mesh.request_face_normals();
    temp_mesh.update_face_normals();
    for(TriMesh::FaceIter f_it = temp_mesh.faces_begin(); f_it != temp_mesh.faces_end(); f_it++)
        mollified_normals[(*f_it).idx()] = temp_mesh.normal(*f_it);
}